

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O2

void __thiscall
ptc::Print<char>::print_backend<std::__cxx11::ostringstream&,int,char_const(&)[5],char_const(&)[8]>
          (Print<char> *this,
          basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *os,int *first,
          char (*args) [5],char (*args_1) [8])

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  bool bVar3;
  ANSI in_EAX;
  ostream *poVar4;
  ANSI local_38 [2];
  
  local_38[0] = in_EAX;
  std::mutex::lock((mutex *)mutex_);
  pbVar1 = &this->pattern;
  if ((this->pattern)._M_string_length == 0) {
    std::ostream::operator<<(os,*first);
  }
  else {
    poVar4 = std::operator<<((ostream *)os,(string *)pbVar1);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,*first);
    std::operator<<(poVar4,(string *)pbVar1);
  }
  pbVar2 = &this->sep;
  if ((this->pattern)._M_string_length == 0) {
    poVar4 = std::operator<<((ostream *)os,(string *)pbVar2);
    std::operator<<(poVar4,*args);
    poVar4 = std::operator<<((ostream *)os,(string *)pbVar2);
    std::operator<<(poVar4,*args_1);
  }
  else {
    poVar4 = std::operator<<((ostream *)os,(string *)pbVar2);
    poVar4 = std::operator<<(poVar4,(string *)pbVar1);
    poVar4 = std::operator<<(poVar4,*args);
    std::operator<<(poVar4,(string *)pbVar1);
    poVar4 = std::operator<<((ostream *)os,(string *)pbVar2);
    poVar4 = std::operator<<(poVar4,(string *)pbVar1);
    poVar4 = std::operator<<(poVar4,*args_1);
    std::operator<<(poVar4,(string *)pbVar1);
  }
  std::operator<<((ostream *)os,(string *)this);
  local_38[1] = 1;
  bVar3 = is_escape<char[5]>(args,local_38 + 1);
  if (!bVar3) {
    local_38[0] = generic;
    bVar3 = is_escape<char[8]>(args_1,local_38);
    if (!bVar3) goto LAB_00133920;
  }
  std::operator<<((ostream *)os,"\x1b[0m");
LAB_00133920:
  if (this->flush == true) {
    std::ostream::flush();
  }
  pthread_mutex_unlock((pthread_mutex_t *)mutex_);
  return;
}

Assistant:

void print_backend( T_os&& os, T&& first, Args&&... args ) const
     {
      std::lock_guard <std::mutex> lock{ mutex_ };

      // Printing the first argument
      if( is_escape( first, ANSI::first ) || pattern.empty() ) os << first;
      else os << pattern << first << pattern;
      
      // Printing all the other arguments
      if constexpr( sizeof...( args ) > 0 ) 
       {
        if ( is_escape( first, ANSI::first ) ) 
         {
          if( pattern.empty() ) ( ( os << args << sep ), ...);
          else ( ( os << pattern << args << pattern << sep ), ...);
         }
        else 
         {
          if( pattern.empty() ) ( ( os << sep << args ), ...);
          else ( ( os << sep << pattern << args << pattern ), ...);
         }
       }
      os << end;
      
      // Resetting the stream from ANSI escape sequences
      if constexpr( sizeof...( args ) > 0 )
       {
        if ( is_escape( first, ANSI::generic ) || ( ( is_escape( args, ANSI::generic ) ) || ...) )
         {
          os << "\033[0m";
         }
       }
      else 
       {
       if ( is_escape( first, ANSI::generic ) ) 
        {
         os << "\033[0m";
        }
       }

      // Other operations
      if ( flush ) os << std::flush;
     }